

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregocal.cpp
# Opt level: O0

double icu_63::GregorianCalendar::computeJulianDayOfYear
                 (UBool isGregorian,int32_t year,UBool *isLeap)

{
  int32_t iVar1;
  bool local_32;
  bool local_31;
  double local_28;
  double julianDay;
  int32_t y;
  UBool *isLeap_local;
  int32_t year_local;
  UBool isGregorian_local;
  
  *isLeap = year % 4 == 0;
  iVar1 = ClockMath::floorDivide(year + -1,4);
  local_28 = (double)(year + -1) * 365.0 + (double)iVar1 + 1721423.0;
  if (isGregorian != '\0') {
    local_31 = false;
    if (*isLeap != '\0') {
      local_32 = year % 100 != 0 || year % 400 == 0;
      local_31 = local_32;
    }
    *isLeap = local_31;
    iVar1 = Grego::gregorianShift(year);
    local_28 = (double)iVar1 + local_28;
  }
  return local_28;
}

Assistant:

double GregorianCalendar::computeJulianDayOfYear(UBool isGregorian,
                                                 int32_t year, UBool& isLeap)
{
    isLeap = year%4 == 0;
    int32_t y = year - 1;
    double julianDay = 365.0*y + ClockMath::floorDivide(y, 4) + (kJan1_1JulianDay - 3);

    if (isGregorian) {
        isLeap = isLeap && ((year%100 != 0) || (year%400 == 0));
        // Add 2 because Gregorian calendar starts 2 days after Julian calendar
        julianDay += Grego::gregorianShift(year);
    }

    return julianDay;
}